

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

string * google::protobuf::compiler::python::anon_unknown_0::ModuleAlias
                   (string *__return_storage_ptr__,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_60;
  string local_40;
  
  ModuleName(__return_storage_ptr__,filename);
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"_","");
  paVar2 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"__","");
  GlobalReplaceSubstring(&local_40,&local_60,__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".","");
  local_60._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"_dot_","");
  GlobalReplaceSubstring(&local_40,&local_60,__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ModuleAlias(const std::string& filename) {
  std::string module_name = ModuleName(filename);
  // We can't have dots in the module name, so we replace each with _dot_.
  // But that could lead to a collision between a.b and a_dot_b, so we also
  // duplicate each underscore.
  GlobalReplaceSubstring("_", "__", &module_name);
  GlobalReplaceSubstring(".", "_dot_", &module_name);
  return module_name;
}